

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O0

TreeDFIterator<spvtools::opt::DominatorTreeNode> * __thiscall
spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>::operator++
          (TreeDFIterator<spvtools::opt::DominatorTreeNode> *this)

{
  TreeDFIterator<spvtools::opt::DominatorTreeNode> *this_local;
  
  MoveToNextNode(this);
  return this;
}

Assistant:

TreeDFIterator& operator++() {
    MoveToNextNode();
    return *this;
  }